

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall
icu_63::TextTrieMap::putImpl(TextTrieMap *this,UnicodeString *key,void *value,UErrorCode *status)

{
  ushort uVar1;
  CharacterNode *parent;
  UnicodeString *this_00;
  ulong uVar2;
  char16_t *pcVar3;
  UnicodeString foldedKey;
  UnicodeString local_70;
  
  parent = this->fNodes;
  if (parent == (CharacterNode *)0x0) {
    this->fNodesCapacity = 0x200;
    parent = (CharacterNode *)uprv_malloc_63(0x2000);
    this->fNodes = parent;
    if (parent == (CharacterNode *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    parent->fValues = (void *)0x0;
    parent->fCharacter = L'\0';
    parent->fFirstChild = 0;
    parent->fNextSibling = 0;
    parent->fHasValuesVector = '\0';
    parent->fPadding = '\0';
    this->fNodesCount = 1;
  }
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  if (this->fIgnoreCase == '\0') {
    uVar1 = (key->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        pcVar3 = (key->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (key->fUnion).fStackFields.fBuffer;
      }
    }
    else {
      pcVar3 = (char16_t *)0x0;
    }
    if ((short)uVar1 < 0) {
      local_70.fUnion.fFields.fLength = (key->fUnion).fFields.fLength;
    }
    else {
      local_70.fUnion.fFields.fLength = (int)(short)uVar1 >> 5;
    }
  }
  else {
    this_00 = UnicodeString::fastCopyFrom(&local_70,key);
    UnicodeString::foldCase(this_00,0);
    if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
      }
    }
    else {
      local_70.fUnion.fFields.fArray = (char16_t *)0x0;
    }
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    parent = this->fNodes;
    pcVar3 = local_70.fUnion.fFields.fArray;
  }
  if (0 < local_70.fUnion.fFields.fLength) {
    uVar2 = 0;
    do {
      parent = addChildNode(this,parent,pcVar3[uVar2],status);
      uVar2 = uVar2 + 1;
    } while ((uint)local_70.fUnion.fFields.fLength != uVar2);
  }
  CharacterNode::addValue(parent,value,this->fValueDeleter,status);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
TextTrieMap::putImpl(const UnicodeString &key, void *value, UErrorCode &status) {
    if (fNodes == NULL) {
        fNodesCapacity = 512;
        fNodes = (CharacterNode *)uprv_malloc(fNodesCapacity * sizeof(CharacterNode));
        if (fNodes == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        fNodes[0].clear();  // Init root node.
        fNodesCount = 1;
    }

    UnicodeString foldedKey;
    const UChar *keyBuffer;
    int32_t keyLength;
    if (fIgnoreCase) {
        // Ok to use fastCopyFrom() because we discard the copy when we return.
        foldedKey.fastCopyFrom(key).foldCase();
        keyBuffer = foldedKey.getBuffer();
        keyLength = foldedKey.length();
    } else {
        keyBuffer = key.getBuffer();
        keyLength = key.length();
    }

    CharacterNode *node = fNodes;
    int32_t index;
    for (index = 0; index < keyLength; ++index) {
        node = addChildNode(node, keyBuffer[index], status);
    }
    node->addValue(value, fValueDeleter, status);
}